

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::ValidationContextImpl::getURIForPrefix(ValidationContextImpl *this,XMLCh *prefix)

{
  uint uriId;
  XMLCh *pXVar1;
  bool unknown;
  bool local_9;
  
  local_9 = false;
  if (this->fElemStack == (ElemStack *)0x0) {
    if (this->fNamespaceScope == (NamespaceScope *)0x0) {
      uriId = 0;
    }
    else {
      uriId = (**(this->fNamespaceScope->super_XercesNamespaceResolver).
                 _vptr_XercesNamespaceResolver)();
      local_9 = uriId == this->fNamespaceScope->fEmptyNamespaceId;
    }
  }
  else {
    uriId = ElemStack::mapPrefixToURI(this->fElemStack,prefix,&local_9);
  }
  if (local_9 == false) {
    pXVar1 = XMLScanner::getURIText(this->fScanner,uriId);
  }
  else {
    pXVar1 = L"";
  }
  return pXVar1;
}

Assistant:

const XMLCh* ValidationContextImpl::getURIForPrefix(XMLCh* prefix) {
    bool unknown = false;
    unsigned int uriId = 0;
    if(fElemStack)
        uriId = fElemStack->mapPrefixToURI(prefix, unknown);
    else if(fNamespaceScope)
    {
      uriId = fNamespaceScope->getNamespaceForPrefix(prefix);
      unknown = uriId == fNamespaceScope->getEmptyNamespaceId();
    }
    if (!unknown)
        return fScanner->getURIText(uriId);

    return XMLUni::fgZeroLenString;
}